

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetPropDelay(Wln_Ret_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Wln_Ntk_t *pWVar2;
  int *piVar3;
  int iVar4;
  int iObj;
  long lVar5;
  
  (p->vSinks).nSize = 0;
  pWVar2 = p->pNtk;
  iVar4 = 0;
  if (1 < (pWVar2->vTypes).nSize) {
    p_00 = &p->vSinks;
    iVar4 = 0;
    lVar5 = 1;
    do {
      if ((pWVar2->vTypes).pArray[lVar5] - 5U < 0xfffffffe) {
        iObj = (int)lVar5;
        iVar1 = Wln_RetPropDelay_rec(p,iObj);
        if (iVar4 == iVar1) {
          Vec_IntPush(p_00,iObj);
        }
        else if (iVar4 < iVar1) {
          if (p_00->nCap < 1) {
            piVar3 = (p->vSinks).pArray;
            if (piVar3 == (int *)0x0) {
              piVar3 = (int *)malloc(4);
            }
            else {
              piVar3 = (int *)realloc(piVar3,4);
            }
            (p->vSinks).pArray = piVar3;
            if (piVar3 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_00->nCap = 1;
          }
          *(p->vSinks).pArray = iObj;
          (p->vSinks).nSize = 1;
          iVar4 = iVar1;
        }
      }
      lVar5 = lVar5 + 1;
      pWVar2 = p->pNtk;
    } while (lVar5 < (pWVar2->vTypes).nSize);
  }
  return iVar4;
}

Assistant:

int Wln_RetPropDelay( Wln_Ret_t * p )
{
    int iObj, DelayMax = 0;
    Vec_IntClear( &p->vSinks );
    Wln_NtkForEachObj( p->pNtk, iObj )
        if ( !Wln_ObjIsCio(p->pNtk, iObj) )
        {
            int Delay = Wln_RetPropDelay_rec(p, iObj);
            if ( DelayMax == Delay )
                Vec_IntPush( &p->vSinks, iObj );
            else if ( DelayMax < Delay )
            {
                DelayMax = Delay;
                Vec_IntFill( &p->vSinks, 1, iObj );
            }
        }

//    Vec_IntForEachEntry( &p->vPathDelays, iObj, i )
//        printf( "Obj = %d.  Delay = %d.\n", i, iObj );
//    printf( "\n" );

//    printf( "Sinks: " );
//    Vec_IntPrint( &p->vSinks );

    return DelayMax;
}